

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateModuleFunctionPrototypes(ExpressionTranslateContext *ctx)

{
  FunctionData *function;
  ScopeData *pSVar1;
  SynIdentifier *pSVar2;
  VariableHandle *pVVar3;
  bool bVar4;
  FunctionData **ppFVar5;
  ArgumentData *pAVar6;
  uint uVar7;
  char *pcVar8;
  uint i_1;
  uint index;
  uint i;
  uint index_00;
  IntrusiveList<VariableHandle> *pIVar9;
  InplaceStr name;
  InplaceStr local_40;
  
  PrintIndentedLine(ctx,"// Function prototypes");
  index_00 = 0;
  do {
    if ((ctx->ctx->functions).count <= index_00) {
      PrintLine(ctx);
      return;
    }
    ppFVar5 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->ctx->functions,index_00);
    function = *ppFVar5;
    bVar4 = ExpressionContext::IsGenericFunction(ctx->ctx,function);
    if ((!bVar4) && (function->implementation == (FunctionData *)0x0)) {
      pSVar1 = function->scope;
      if ((((pSVar1 == ctx->ctx->globalScope) ||
           ((pSVar1->ownerNamespace != (NamespaceData *)0x0 ||
            (pSVar1->ownerType != (TypeBase *)0x0)))) && (*(function->name->name).begin != '$')) &&
         (function->isHidden != true)) {
        bVar4 = ExpressionContext::IsGenericInstance(ctx->ctx,function);
        pcVar8 = "template<int I> ";
        if (bVar4) {
LAB_00141336:
          Print(ctx,pcVar8);
        }
        TranslateTypeName(ctx,function->type->returnType);
        Print(ctx," ");
        TranslateFunctionName(ctx,function);
        Print(ctx,"(");
        if (function->importModule == (ModuleData *)0x0) {
          pIVar9 = &function->argumentVariables;
          while (pVVar3 = pIVar9->head, pVVar3 != (VariableHandle *)0x0) {
            TranslateTypeName(ctx,pVVar3->variable->type);
            Print(ctx," ");
            TranslateVariableName(ctx,pVVar3->variable);
            Print(ctx,", ");
            pIVar9 = (IntrusiveList<VariableHandle> *)&pVVar3->next;
          }
          TranslateTypeName(ctx,function->contextArgument->type);
          Print(ctx," ");
          TranslateVariableName(ctx,function->contextArgument);
        }
        else {
          for (index = 0; index < (function->arguments).count; index = index + 1) {
            pAVar6 = SmallArray<ArgumentData,_4U>::operator[](&function->arguments,index);
            TranslateTypeName(ctx,pAVar6->type);
            Print(ctx," ");
            local_40.begin = "this";
            local_40.end = "";
            bVar4 = InplaceStr::operator==(&pAVar6->name->name,&local_40);
            if (bVar4) {
              Print(ctx,"__context");
            }
            else {
              pSVar2 = pAVar6->name;
              pcVar8 = (pSVar2->name).begin;
              if (*pcVar8 == '$') {
                InplaceStr::InplaceStr(&local_40,pcVar8 + 1,(pSVar2->name).end);
                uVar7 = (int)local_40.end - (int)local_40.begin;
                pcVar8 = "__%.*s";
              }
              else {
                uVar7 = *(int *)&(pSVar2->name).end - (int)pcVar8;
                pcVar8 = "%.*s";
              }
              Print(ctx,pcVar8,(ulong)uVar7);
            }
            Print(ctx,", ");
          }
          TranslateTypeName(ctx,function->contextType);
          Print(ctx," __context");
        }
        Print(ctx,");");
        PrintLine(ctx);
      }
      else {
        pcVar8 = "static ";
        if (function->importModule == (ModuleData *)0x0) goto LAB_00141336;
      }
    }
    index_00 = index_00 + 1;
  } while( true );
}

Assistant:

void TranslateModuleFunctionPrototypes(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Function prototypes");

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
			continue;

		if(function->implementation)
			continue;

		bool isStatic = false;
		bool isGeneric = false;

		if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
			isStatic = true;
		else if(*function->name->name.begin == '$')
			isStatic = true;
		else if(function->isHidden)
			isStatic = true;
		else if(ctx.ctx.IsGenericInstance(function))
			isGeneric = true;

		if(isStatic && function->importModule)
			continue;

		if(isStatic)
			Print(ctx, "static ");
		else if(isGeneric)
			Print(ctx, "template<int I> ");

		TranslateTypeName(ctx, function->type->returnType);
		Print(ctx, " ");
		TranslateFunctionName(ctx, function);
		Print(ctx, "(");

		if(function->importModule)
		{
			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &argument = function->arguments[i];

				TranslateTypeName(ctx, argument.type);
				Print(ctx, " ");

				if(argument.name->name == InplaceStr("this"))
				{
					Print(ctx, "__context");
				}
				else if(*argument.name->name.begin == '$')
				{
					InplaceStr name = InplaceStr(argument.name->name.begin + 1, argument.name->name.end);

					Print(ctx, "__%.*s", FMT_ISTR(name));
				}
				else
				{
					Print(ctx, "%.*s", FMT_ISTR(argument.name->name));
				}

				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, function->contextType);
			Print(ctx, " __context");
		}
		else
		{
			for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
			{
				TranslateTypeName(ctx, curr->variable->type);
				Print(ctx, " ");
				TranslateVariableName(ctx, curr->variable);
				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, function->contextArgument->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, function->contextArgument);
		}

		Print(ctx, ");");
		PrintLine(ctx);
	}

	PrintLine(ctx);
}